

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR reparse_unary_expr(ly_ctx *ctx,lyxp_expr *exp,uint32_t *tok_idx,uint32_t depth)

{
  uint32_t uVar1;
  LY_ERR LVar2;
  bool bVar3;
  LY_ERR ret___1;
  LY_ERR ret__;
  LY_ERR rc;
  uint32_t prev_exp;
  uint32_t depth_local;
  uint32_t *tok_idx_local;
  lyxp_expr *exp_local;
  ly_ctx *ctx_local;
  
  uVar1 = *tok_idx;
  while( true ) {
    LVar2 = lyxp_check_token((ly_ctx *)0x0,exp,*tok_idx,LYXP_TOKEN_OPER_MATH);
    bVar3 = false;
    if (LVar2 == LY_SUCCESS) {
      bVar3 = exp->expr[exp->tok_pos[*tok_idx]] == '-';
    }
    if (!bVar3) break;
    exp_repeat_push(exp,uVar1,LYXP_EXPR_UNARY);
    *tok_idx = *tok_idx + 1;
  }
  uVar1 = *tok_idx;
  LVar2 = reparse_path_expr(ctx,exp,tok_idx,depth);
  while( true ) {
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    LVar2 = lyxp_check_token((ly_ctx *)0x0,exp,*tok_idx,LYXP_TOKEN_OPER_UNI);
    if (LVar2 != LY_SUCCESS) break;
    exp_repeat_push(exp,uVar1,LYXP_EXPR_UNION);
    *tok_idx = *tok_idx + 1;
    LVar2 = reparse_path_expr(ctx,exp,tok_idx,depth);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
reparse_unary_expr(const struct ly_ctx *ctx, struct lyxp_expr *exp, uint32_t *tok_idx, uint32_t depth)
{
    uint32_t prev_exp;
    LY_ERR rc;

    /* ('-')* */
    prev_exp = *tok_idx;
    while (!lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_OPER_MATH) &&
            (exp->expr[exp->tok_pos[*tok_idx]] == '-')) {
        exp_repeat_push(exp, prev_exp, LYXP_EXPR_UNARY);
        ++(*tok_idx);
    }

    /* PathExpr */
    prev_exp = *tok_idx;
    rc = reparse_path_expr(ctx, exp, tok_idx, depth);
    LY_CHECK_RET(rc);

    /* ('|' PathExpr)* */
    while (!lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_OPER_UNI)) {
        exp_repeat_push(exp, prev_exp, LYXP_EXPR_UNION);
        ++(*tok_idx);

        rc = reparse_path_expr(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
    }

    return LY_SUCCESS;
}